

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.cpp
# Opt level: O0

p_ply_property_conflict ply_get_next_property(p_ply_element element,p_ply_property_conflict last)

{
  p_ply_property_conflict last_local;
  p_ply_element element_local;
  p_ply_property_conflict local_8;
  
  if (last == (p_ply_property_conflict)0x0) {
    local_8 = element->property;
  }
  else {
    local_8 = last + 1;
    if (element->property + element->nproperties <= local_8) {
      local_8 = (p_ply_property_conflict)0x0;
    }
  }
  return local_8;
}

Assistant:

p_ply_property ply_get_next_property(p_ply_element element,
                                     p_ply_property last) {
    assert(element);
    if (!last) return element->property;
    last++;
    if (last < element->property + element->nproperties)
        return last;
    else
        return NULL;
}